

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O0

void Diligent::ValidateTextureRegion(TextureDesc *TexDesc,Uint32 MipLevel,Uint32 Slice,Box *Box)

{
  bool bVar1;
  uint *puVar2;
  Char *pCVar3;
  uint uVar4;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  TextureFormatAttribs *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  uint local_174;
  uint local_170;
  uint local_16c;
  char *pcStack_168;
  Uint32 MipDepth;
  uint local_15c;
  char *local_158;
  uint local_14c;
  char *local_148;
  char *local_140;
  uint local_134;
  undefined1 local_130 [4];
  Uint32 BlockAlignedMipHeight;
  string msg_1;
  uint local_108;
  uint local_104;
  char *pcStack_100;
  Uint32 MipHeight;
  uint local_f4;
  char *local_f0;
  uint local_e4;
  char *local_e0;
  char *local_d8;
  uint local_d0 [2];
  Uint32 BlockAlignedMipWidth;
  undefined1 local_c0 [8];
  string msg;
  uint local_98;
  uint local_94;
  TextureFormatAttribs *pTStack_90;
  Uint32 MipWidth;
  TextureFormatAttribs *FmtAttribs;
  uint local_7c;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  uint local_54;
  char *local_50;
  Box *local_48;
  Box *Box_local;
  Uint32 Slice_local;
  Uint32 MipLevel_local;
  TextureDesc *TexDesc_local;
  
  local_48 = Box;
  Box_local._0_4_ = Slice;
  Box_local._4_4_ = MipLevel;
  _Slice_local = TexDesc;
  if (TexDesc->MipLevels <= MipLevel) {
    if ((TexDesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_198 = "";
    }
    else {
      local_198 = (TexDesc->super_DeviceObjectAttribs).Name;
    }
    local_50 = local_198;
    local_54 = TexDesc->MipLevels - 1;
    LogError<false,char[10],char_const*,char[4],char[12],unsigned_int,char[31],unsigned_int,char[2]>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x151,(char (*) [10])0x4867c2,&local_50,(char (*) [4])"\': ",
               (char (*) [12])"Mip level (",(uint *)((long)&Box_local + 4),
               (char (*) [31])") is out of allowed range [0, ",&local_54,(char (*) [2])0x465aaf);
  }
  if (local_48->MaxX <= local_48->MinX) {
    if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_1a0 = "";
    }
    else {
      local_1a0 = (_Slice_local->super_DeviceObjectAttribs).Name;
    }
    local_60 = local_1a0;
    LogError<false,char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x152,(char (*) [10])0x4867c2,&local_60,(char (*) [4])"\': ",
               (char (*) [18])"Invalid X range: ",&local_48->MinX,(char (*) [3])"..",&local_48->MaxX
              );
  }
  if (local_48->MaxY <= local_48->MinY) {
    if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_1a8 = "";
    }
    else {
      local_1a8 = (_Slice_local->super_DeviceObjectAttribs).Name;
    }
    local_68 = local_1a8;
    LogError<false,char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x153,(char (*) [10])0x4867c2,&local_68,(char (*) [4])"\': ",
               (char (*) [18])"Invalid Y range: ",&local_48->MinY,(char (*) [3])"..",&local_48->MaxY
              );
  }
  if (local_48->MaxZ <= local_48->MinZ) {
    if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_1b0 = "";
    }
    else {
      local_1b0 = (_Slice_local->super_DeviceObjectAttribs).Name;
    }
    local_70 = local_1b0;
    LogError<false,char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x154,(char (*) [10])0x4867c2,&local_70,(char (*) [4])"\': ",
               (char (*) [18])"Invalid Z range: ",&local_48->MinZ,(char (*) [3])"..",&local_48->MaxZ
              );
  }
  bVar1 = TextureDesc::IsArray(_Slice_local);
  if (bVar1) {
    if ((_Slice_local->field_3).ArraySize <= (Uint32)Box_local) {
      if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_1b8 = "";
      }
      else {
        local_1b8 = (_Slice_local->super_DeviceObjectAttribs).Name;
      }
      local_78 = local_1b8;
      local_7c = (_Slice_local->field_3).ArraySize - 1;
      LogError<false,char[10],char_const*,char[4],char[14],unsigned_int,char[22],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x158,(char (*) [10])0x4867c2,&local_78,(char (*) [4])"\': ",
                 (char (*) [14])"Array slice (",(uint *)&Box_local,
                 (char (*) [22])") is out of range [0,",&local_7c,(char (*) [3])0x45cb22);
    }
  }
  else if ((Uint32)Box_local != 0) {
    if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_1c0 = (TextureFormatAttribs *)0x46c893;
    }
    else {
      local_1c0 = (TextureFormatAttribs *)(_Slice_local->super_DeviceObjectAttribs).Name;
    }
    FmtAttribs = local_1c0;
    LogError<false,char[10],char_const*,char[4],char[14],unsigned_int,char[36]>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x15c,(char (*) [10])0x4867c2,(char **)&FmtAttribs,(char (*) [4])"\': ",
               (char (*) [14])"Array slice (",(uint *)&Box_local,
               (char (*) [36])") must be 0 for non-array textures.");
  }
  pTStack_90 = GetTextureFormatAttribs(_Slice_local->Format);
  local_98 = _Slice_local->Width >> ((byte)Box_local._4_4_ & 0x1f);
  msg.field_2._12_4_ = 1;
  puVar2 = std::max<unsigned_int>(&local_98,(uint *)(msg.field_2._M_local_buf + 0xc));
  local_94 = *puVar2;
  if (pTStack_90->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    uVar4 = pTStack_90->BlockWidth - 1;
    if ((pTStack_90->BlockWidth & uVar4) != 0) {
      FormatString<char[26],char[59]>
                ((string *)local_c0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(FmtAttribs.BlockWidth & (FmtAttribs.BlockWidth - 1)) == 0",
                 (char (*) [59])(ulong)uVar4);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x164);
      std::__cxx11::string::~string((string *)local_c0);
    }
    local_d0[0] = local_94 + (pTStack_90->BlockWidth - 1) &
                  (pTStack_90->BlockWidth - 1 ^ 0xffffffff);
    if (local_d0[0] < local_48->MaxX) {
      if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_1d0 = "";
      }
      else {
        local_1d0 = (_Slice_local->super_DeviceObjectAttribs).Name;
      }
      local_d8 = local_1d0;
      LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[31],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x166,(char (*) [10])0x4867c2,&local_d8,(char (*) [4])"\': ",
                 (char (*) [26])"Region max X coordinate (",&local_48->MaxX,
                 (char (*) [31])") is out of allowed range [0, ",local_d0,(char (*) [3])0x45cb22);
    }
    if (local_48->MinX % (uint)pTStack_90->BlockWidth != 0) {
      if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_1d8 = "";
      }
      else {
        local_1d8 = (_Slice_local->super_DeviceObjectAttribs).Name;
      }
      local_e0 = local_1d8;
      local_e4 = (uint)pTStack_90->BlockWidth;
      LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[38],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x167,(char (*) [10])0x4867c2,&local_e0,(char (*) [4])"\': ",
                 (char (*) [54])"For compressed formats, the region min X coordinate (",
                 &local_48->MinX,(char (*) [38])") must be a multiple of block width (",&local_e4,
                 (char (*) [3])0x490759);
    }
    if ((local_48->MaxX % (uint)pTStack_90->BlockWidth != 0) && (local_48->MaxX != local_94)) {
      if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_1e0 = "";
      }
      else {
        local_1e0 = (_Slice_local->super_DeviceObjectAttribs).Name;
      }
      local_f0 = local_1e0;
      local_f4 = (uint)pTStack_90->BlockWidth;
      LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[38],unsigned_int,char[33],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x168,(char (*) [10])0x4867c2,&local_f0,(char (*) [4])"\': ",
                 (char (*) [54])"For compressed formats, the region max X coordinate (",
                 &local_48->MaxX,(char (*) [38])") must be a multiple of block width (",&local_f4,
                 (char (*) [33])") or equal the mip level width (",&local_94,(char (*) [3])0x490759)
      ;
    }
  }
  else if (local_94 < local_48->MaxX) {
    if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_1e8 = "";
    }
    else {
      local_1e8 = (_Slice_local->super_DeviceObjectAttribs).Name;
    }
    pcStack_100 = local_1e8;
    LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[31],unsigned_int,char[3]>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x16b,(char (*) [10])0x4867c2,&stack0xffffffffffffff00,(char (*) [4])"\': ",
               (char (*) [26])"Region max X coordinate (",&local_48->MaxX,
               (char (*) [31])") is out of allowed range [0, ",&local_94,(char (*) [3])0x45cb22);
  }
  if ((_Slice_local->Type != RESOURCE_DIM_TEX_1D) &&
     (_Slice_local->Type != RESOURCE_DIM_TEX_1D_ARRAY)) {
    local_108 = _Slice_local->Height >> ((byte)Box_local._4_4_ & 0x1f);
    msg_1.field_2._12_4_ = 1;
    puVar2 = std::max<unsigned_int>(&local_108,(uint *)(msg_1.field_2._M_local_buf + 0xc));
    local_104 = *puVar2;
    if (pTStack_90->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      uVar4 = pTStack_90->BlockHeight - 1;
      if ((pTStack_90->BlockHeight & uVar4) != 0) {
        FormatString<char[26],char[61]>
                  ((string *)local_130,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"(FmtAttribs.BlockHeight & (FmtAttribs.BlockHeight - 1)) == 0",
                   (char (*) [61])(ulong)uVar4);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"ValidateTextureRegion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x173);
        std::__cxx11::string::~string((string *)local_130);
      }
      local_134 = local_104 + (pTStack_90->BlockHeight - 1) &
                  (pTStack_90->BlockHeight - 1 ^ 0xffffffff);
      if (local_134 < local_48->MaxY) {
        if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_1f8 = "";
        }
        else {
          local_1f8 = (_Slice_local->super_DeviceObjectAttribs).Name;
        }
        local_140 = local_1f8;
        LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[31],unsigned_int,char[3]>
                  (false,"ValidateTextureRegion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x175,(char (*) [10])0x4867c2,&local_140,(char (*) [4])"\': ",
                   (char (*) [26])"Region max Y coordinate (",&local_48->MaxY,
                   (char (*) [31])") is out of allowed range [0, ",&local_134,(char (*) [3])0x45cb22
                  );
      }
      if (local_48->MinY % (uint)pTStack_90->BlockHeight != 0) {
        if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_200 = "";
        }
        else {
          local_200 = (_Slice_local->super_DeviceObjectAttribs).Name;
        }
        local_148 = local_200;
        local_14c = (uint)pTStack_90->BlockHeight;
        LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[39],unsigned_int,char[3]>
                  (false,"ValidateTextureRegion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x176,(char (*) [10])0x4867c2,&local_148,(char (*) [4])"\': ",
                   (char (*) [54])"For compressed formats, the region min Y coordinate (",
                   &local_48->MinY,(char (*) [39])") must be a multiple of block height (",
                   &local_14c,(char (*) [3])0x490759);
      }
      if ((local_48->MaxY % (uint)pTStack_90->BlockHeight != 0) && (local_48->MaxY != local_104)) {
        if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_208 = "";
        }
        else {
          local_208 = (_Slice_local->super_DeviceObjectAttribs).Name;
        }
        local_158 = local_208;
        local_15c = (uint)pTStack_90->BlockHeight;
        LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[39],unsigned_int,char[34],unsigned_int,char[3]>
                  (false,"ValidateTextureRegion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x177,(char (*) [10])0x4867c2,&local_158,(char (*) [4])"\': ",
                   (char (*) [54])"For compressed formats, the region max Y coordinate (",
                   &local_48->MaxY,(char (*) [39])") must be a multiple of block height (",
                   &local_15c,(char (*) [34])") or equal the mip level height (",&local_104,
                   (char (*) [3])0x490759);
      }
    }
    else if (local_104 < local_48->MaxY) {
      if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_210 = "";
      }
      else {
        local_210 = (_Slice_local->super_DeviceObjectAttribs).Name;
      }
      pcStack_168 = local_210;
      LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[31],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x17a,(char (*) [10])0x4867c2,&stack0xfffffffffffffe98,(char (*) [4])"\': ",
                 (char (*) [26])"Region max Y coordinate (",&local_48->MaxY,
                 (char (*) [31])") is out of allowed range [0, ",&local_104,(char (*) [3])0x45cb22);
    }
  }
  if (_Slice_local->Type == RESOURCE_DIM_TEX_3D) {
    local_170 = (_Slice_local->field_3).ArraySize >> ((byte)Box_local._4_4_ & 0x1f);
    local_174 = 1;
    puVar2 = std::max<unsigned_int>(&local_170,&local_174);
    local_16c = *puVar2;
    if (local_16c < local_48->MaxZ) {
      if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_218 = "";
      }
      else {
        local_218 = (_Slice_local->super_DeviceObjectAttribs).Name;
      }
      local_180 = local_218;
      LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[32],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x180,(char (*) [10])0x4867c2,&local_180,(char (*) [4])"\': ",
                 (char (*) [26])"Region max Z coordinate (",&local_48->MaxZ,
                 (char (*) [32])") is out of allowed range  [0, ",&local_16c,(char (*) [3])0x45cb22)
      ;
    }
  }
  else {
    if (local_48->MinZ != 0) {
      if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_220 = "";
      }
      else {
        local_220 = (_Slice_local->super_DeviceObjectAttribs).Name;
      }
      local_188 = local_220;
      LogError<false,char[10],char_const*,char[4],char[15],unsigned_int,char[37]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x184,(char (*) [10])0x4867c2,&local_188,(char (*) [4])"\': ",
                 (char (*) [15])"Region min Z (",&local_48->MinZ,
                 (char (*) [37])") must be 0 for all but 3D textures.");
    }
    if (local_48->MaxZ != 1) {
      if ((_Slice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_228 = "";
      }
      else {
        local_228 = (_Slice_local->super_DeviceObjectAttribs).Name;
      }
      local_190 = local_228;
      LogError<false,char[10],char_const*,char[4],char[15],unsigned_int,char[37]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x185,(char (*) [10])0x4867c2,&local_190,(char (*) [4])"\': ",
                 (char (*) [15])"Region max Z (",&local_48->MaxZ,
                 (char (*) [37])") must be 1 for all but 3D textures.");
    }
  }
  return;
}

Assistant:

void ValidateTextureRegion(const TextureDesc& TexDesc, Uint32 MipLevel, Uint32 Slice, const Box& Box)
{
#define VERIFY_TEX_PARAMS(Expr, ...)                                                          \
    do                                                                                        \
    {                                                                                         \
        if (!(Expr))                                                                          \
        {                                                                                     \
            LOG_ERROR("Texture '", (TexDesc.Name ? TexDesc.Name : ""), "': ", ##__VA_ARGS__); \
        }                                                                                     \
    } while (false)

#ifdef DILIGENT_DEVELOPMENT
    VERIFY_TEX_PARAMS(MipLevel < TexDesc.MipLevels, "Mip level (", MipLevel, ") is out of allowed range [0, ", TexDesc.MipLevels - 1, "]");
    VERIFY_TEX_PARAMS(Box.MinX < Box.MaxX, "Invalid X range: ", Box.MinX, "..", Box.MaxX);
    VERIFY_TEX_PARAMS(Box.MinY < Box.MaxY, "Invalid Y range: ", Box.MinY, "..", Box.MaxY);
    VERIFY_TEX_PARAMS(Box.MinZ < Box.MaxZ, "Invalid Z range: ", Box.MinZ, "..", Box.MaxZ);

    if (TexDesc.IsArray())
    {
        VERIFY_TEX_PARAMS(Slice < TexDesc.ArraySize, "Array slice (", Slice, ") is out of range [0,", TexDesc.ArraySize - 1, "].");
    }
    else
    {
        VERIFY_TEX_PARAMS(Slice == 0, "Array slice (", Slice, ") must be 0 for non-array textures.");
    }

    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);

    Uint32 MipWidth = std::max(TexDesc.Width >> MipLevel, 1U);
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
    {
        VERIFY_EXPR((FmtAttribs.BlockWidth & (FmtAttribs.BlockWidth - 1)) == 0);
        Uint32 BlockAlignedMipWidth = (MipWidth + (FmtAttribs.BlockWidth - 1)) & ~(FmtAttribs.BlockWidth - 1);
        VERIFY_TEX_PARAMS(Box.MaxX <= BlockAlignedMipWidth, "Region max X coordinate (", Box.MaxX, ") is out of allowed range [0, ", BlockAlignedMipWidth, "].");
        VERIFY_TEX_PARAMS((Box.MinX % FmtAttribs.BlockWidth) == 0, "For compressed formats, the region min X coordinate (", Box.MinX, ") must be a multiple of block width (", Uint32{FmtAttribs.BlockWidth}, ").");
        VERIFY_TEX_PARAMS((Box.MaxX % FmtAttribs.BlockWidth) == 0 || Box.MaxX == MipWidth, "For compressed formats, the region max X coordinate (", Box.MaxX, ") must be a multiple of block width (", Uint32{FmtAttribs.BlockWidth}, ") or equal the mip level width (", MipWidth, ").");
    }
    else
        VERIFY_TEX_PARAMS(Box.MaxX <= MipWidth, "Region max X coordinate (", Box.MaxX, ") is out of allowed range [0, ", MipWidth, "].");

    if (TexDesc.Type != RESOURCE_DIM_TEX_1D &&
        TexDesc.Type != RESOURCE_DIM_TEX_1D_ARRAY)
    {
        Uint32 MipHeight = std::max(TexDesc.Height >> MipLevel, 1U);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            VERIFY_EXPR((FmtAttribs.BlockHeight & (FmtAttribs.BlockHeight - 1)) == 0);
            Uint32 BlockAlignedMipHeight = (MipHeight + (FmtAttribs.BlockHeight - 1)) & ~(FmtAttribs.BlockHeight - 1);
            VERIFY_TEX_PARAMS(Box.MaxY <= BlockAlignedMipHeight, "Region max Y coordinate (", Box.MaxY, ") is out of allowed range [0, ", BlockAlignedMipHeight, "].");
            VERIFY_TEX_PARAMS((Box.MinY % FmtAttribs.BlockHeight) == 0, "For compressed formats, the region min Y coordinate (", Box.MinY, ") must be a multiple of block height (", Uint32{FmtAttribs.BlockHeight}, ").");
            VERIFY_TEX_PARAMS((Box.MaxY % FmtAttribs.BlockHeight) == 0 || Box.MaxY == MipHeight, "For compressed formats, the region max Y coordinate (", Box.MaxY, ") must be a multiple of block height (", Uint32{FmtAttribs.BlockHeight}, ") or equal the mip level height (", MipHeight, ").");
        }
        else
            VERIFY_TEX_PARAMS(Box.MaxY <= MipHeight, "Region max Y coordinate (", Box.MaxY, ") is out of allowed range [0, ", MipHeight, "].");
    }

    if (TexDesc.Type == RESOURCE_DIM_TEX_3D)
    {
        Uint32 MipDepth = std::max(TexDesc.Depth >> MipLevel, 1U);
        VERIFY_TEX_PARAMS(Box.MaxZ <= MipDepth, "Region max Z coordinate (", Box.MaxZ, ") is out of allowed range  [0, ", MipDepth, "].");
    }
    else
    {
        VERIFY_TEX_PARAMS(Box.MinZ == 0, "Region min Z (", Box.MinZ, ") must be 0 for all but 3D textures.");
        VERIFY_TEX_PARAMS(Box.MaxZ == 1, "Region max Z (", Box.MaxZ, ") must be 1 for all but 3D textures.");
    }
#endif
}